

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O3

void __thiscall
ImageProvider::provideStreamData(ImageProvider *this,QPDFObjGen *param_1,Pipeline *pipeline)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_81;
  uint local_80;
  action_e local_7c;
  value_type local_78;
  Pl_RunLength *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  Pipeline *pipeline_local;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  int local_2c;
  
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pipeline_local = pipeline;
  iVar3 = std::__cxx11::string::compare((char *)&this->filter);
  if (iVar3 == 0) {
    uVar6 = this->width;
    if (uVar6 >> 0x20 != 0) {
      QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(uVar6);
      uVar6 = this->width;
    }
    local_7c = (action_e)uVar6;
    uVar6 = this->n_stripes * this->stripe_height;
    if (uVar6 >> 0x20 != 0) {
      QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(uVar6);
    }
    local_80 = (uint)uVar6;
    uVar6 = ((this->stripes).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    if ((uVar6 & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar6);
    }
    local_2c = (int)uVar6;
    local_68 = (Pl_RunLength *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_DCT,std::allocator<Pl_DCT>,char_const(&)[14],Pipeline*&,unsigned_int,unsigned_int,int,J_COLOR_SPACE&>
              (a_Stack_60,(Pl_DCT **)&local_68,(allocator<Pl_DCT> *)&local_81,
               (char (*) [14])"image encoder",&pipeline_local,&local_7c,&local_80,&local_2c,
               &this->j_color_space);
    _Var2._M_pi = a_Stack_60[0]._M_pi;
    local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68;
    _Var1._M_pi = local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_68 = (Pl_RunLength *)0x0;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    if ((_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi),
       a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
    }
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&to_delete,&local_78);
    pipeline = local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&this->filter);
    if (iVar3 == 0) {
      local_7c = a_encode;
      local_68 = (Pl_RunLength *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Pl_RunLength,std::allocator<Pl_RunLength>,char_const(&)[14],Pipeline*&,Pl_RunLength::action_e>
                (a_Stack_60,&local_68,(allocator<Pl_RunLength> *)&local_80,
                 (char (*) [14])"image encoder",&pipeline_local,&local_7c);
      _Var2._M_pi = a_Stack_60[0]._M_pi;
      local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68;
      _Var1._M_pi = local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      local_68 = (Pl_RunLength *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      if ((_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi),
         a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
      }
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&to_delete,&local_78);
      pipeline = local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
  uVar6 = this->n_stripes;
  if (uVar6 != 0) {
    sVar4 = this->width;
    sVar5 = this->stripe_height;
    uVar7 = 0;
    do {
      if (sVar5 * sVar4 != 0) {
        uVar6 = 0;
        do {
          Pipeline::writeString((string *)pipeline);
          uVar6 = uVar6 + 1;
          sVar4 = this->width;
          sVar5 = this->stripe_height;
        } while (uVar6 < sVar5 * sVar4);
        uVar6 = this->n_stripes;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar6);
  }
  (**(code **)(*(long *)pipeline + 0x18))(pipeline);
  if (local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
            (&to_delete);
  return;
}

Assistant:

void
ImageProvider::provideStreamData(QPDFObjGen const&, Pipeline* pipeline)
{
    std::vector<std::shared_ptr<Pipeline>> to_delete;
    Pipeline* p = pipeline;
    std::shared_ptr<Pipeline> p_new;

    if (filter == "/DCTDecode") {
        p_new = std::make_shared<Pl_DCT>(
            "image encoder",
            pipeline,
            QIntC::to_uint(width),
            QIntC::to_uint(getHeight()),
            QIntC::to_int(stripes[0].length()),
            j_color_space);
        to_delete.push_back(p_new);
        p = p_new.get();
    } else if (filter == "/RunLengthDecode") {
        p_new = std::make_shared<Pl_RunLength>("image encoder", pipeline, Pl_RunLength::a_encode);
        to_delete.push_back(p_new);
        p = p_new.get();
    }

    for (size_t i = 0; i < n_stripes; ++i) {
        for (size_t j = 0; j < width * stripe_height; ++j) {
            p->writeString(stripes[i]);
        }
    }
    p->finish();
}